

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void pulse_prog_glass(CHAR_DATA *mob)

{
  CHAR_DATA *ch;
  bool bVar1;
  int iVar2;
  AFFECT_DATA caf;
  AFFECT_DATA af;
  
  ch = mob->fighting;
  if ((ch != (CHAR_DATA *)0x0) && (ch->in_room == mob->in_room)) {
    iVar2 = number_percent();
    if (0x5a < iVar2) {
      bVar1 = is_affected(mob,(int)gsn_trophy);
      if (!bVar1) {
        bVar1 = is_affected(ch,(int)gsn_impale);
        if (!bVar1) {
          act("$n raises one of its massive arms and impales $N on it!",mob,(void *)0x0,ch,1);
          act("$n raises one of its massive arms and impales you on it!",mob,(void *)0x0,ch,2);
          iVar2 = dice(0x10,0xf);
          damage_new(mob,ch,iVar2,-1,2,true,false,0,1,"impalement");
          init_affect(&af);
          af.where = 0;
          af.location = 1;
          af.level = mob->level;
          af.modifier = af.level / -7;
          af.duration = af.level / 4;
          af.type = gsn_bleeding;
          af.aftype = 3;
          af.owner = mob->leader;
          af.end_fun = (AFF_FUN *)0x0;
          new_affect_to_char(ch,&af);
          af.location = 2;
          affect_to_char(ch,&af);
          init_affect(&caf);
          caf.where = 0;
          caf.modifier = 0;
          caf.type = gsn_trophy;
          caf.level = mob->level;
          caf.owner = mob->leader;
          caf.end_fun = (AFF_FUN *)0x0;
          caf._32_4_ = 1;
          caf.aftype = 1;
          new_affect_to_char(mob,&caf);
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_glass(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	AFFECT_DATA af, caf;

	if (victim
		&& victim->in_room == mob->in_room
		&& number_percent() > 90
		&& !is_affected(mob, gsn_trophy)
		&& !is_affected(victim, gsn_impale))
	{
		act("$n raises one of its massive arms and impales $N on it!", mob, 0, victim, TO_NOTVICT);
		act("$n raises one of its massive arms and impales you on it!", mob, 0, victim, TO_VICT);

		damage_new(mob, victim, dice(16, 15), TYPE_UNDEFINED, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "impalement");

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.location = APPLY_STR;
		af.modifier = -mob->level / 7;
		af.duration = mob->level / 4;
		af.type = gsn_bleeding;
		af.aftype = AFT_MALADY;
		af.level = mob->level;
		af.owner = mob->leader;
		af.end_fun = nullptr;
		new_affect_to_char(victim, &af);

		af.location = APPLY_DEX;
		affect_to_char(victim, &af);

		init_affect(&caf);
		caf.where = TO_AFFECTS;
		caf.location = 0;
		caf.modifier = 0;
		caf.duration = 1;
		caf.type = gsn_trophy;
		caf.level = mob->level;
		caf.aftype = AFT_SKILL;
		caf.owner = mob->leader;
		caf.end_fun = nullptr;
		new_affect_to_char(mob, &caf);
	}
}